

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void Catch::defaultListReporters
               (ostream *out,
               vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
               *descriptions,Verbosity verbosity)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  pointer pRVar9;
  pointer text;
  char local_109;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  ulong local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Verbosity local_e4;
  size_t local_e0;
  Column local_d8;
  pointer local_98;
  size_t local_90;
  Column local_88;
  Columns local_48;
  
  local_e4 = verbosity;
  std::__ostream_insert<char,std::char_traits<char>>(out,"Available reporters:\n",0x15);
  text = (descriptions->
         super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pRVar9 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pRVar4 = text + 1;
  pRVar5 = text;
  pRVar6 = text;
  if (pRVar4 != pRVar9 && text != pRVar9) {
    do {
      pRVar5 = pRVar4;
      if ((pRVar4->name)._M_string_length <= (pRVar6->name)._M_string_length) {
        pRVar5 = pRVar6;
      }
      pRVar4 = pRVar4 + 1;
      pRVar6 = pRVar5;
    } while (pRVar4 != pRVar9);
  }
  if (text != pRVar9) {
    sVar2 = (pRVar5->name)._M_string_length;
    paVar1 = &local_d8.m_string.m_string.field_2;
    local_90 = 0x48 - sVar2;
    local_e0 = sVar2 + 5;
    local_98 = pRVar9;
    do {
      if (local_e4 == Quiet) {
        TextFlow::Column::Column(&local_d8,&text->name);
        local_d8.m_indent = 2;
        local_d8.m_width = local_e0;
        TextFlow::operator<<(out,&local_d8);
        local_88.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_88,1);
        uVar7 = local_d8.m_string.m_string.field_2._M_allocated_capacity;
        _Var8._M_p = local_d8.m_string.m_string._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.m_string.m_string._M_dataplus._M_p != paVar1) goto LAB_00150a43;
      }
      else {
        pcVar3 = (text->name)._M_dataplus._M_p;
        local_108 = &local_f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar3,pcVar3 + (text->name)._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_108,local_100,0,'\x01');
        if (local_108 == &local_f8) {
          local_d8.m_string.m_string.field_2._8_8_ = local_f8._8_8_;
          local_d8.m_string.m_string._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_d8.m_string.m_string._M_dataplus._M_p = (pointer)local_108;
        }
        local_d8.m_string.m_string.field_2._M_allocated_capacity._1_7_ =
             local_f8._M_allocated_capacity._1_7_;
        local_d8.m_string.m_string.field_2._M_local_buf[0] = local_f8._M_local_buf[0];
        local_d8.m_string.m_string._M_string_length = local_100;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        local_d8.m_string.m_size = 0;
        local_108 = &local_f8;
        TextFlow::AnsiSkippingString::preprocessString(&local_d8.m_string);
        local_d8.m_initialIndent = 0xffffffffffffffff;
        local_d8.m_indent = 2;
        local_d8.m_width = local_e0;
        TextFlow::Column::Column(&local_88,&text->description);
        local_88.m_initialIndent = 0;
        local_88.m_indent = 2;
        local_88.m_width = local_90;
        TextFlow::operator+(&local_48,&local_d8,&local_88);
        TextFlow::operator<<(out,&local_48);
        pRVar9 = local_98;
        local_109 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_109,1);
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                  (&local_48.m_columns);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_88.m_string.m_string._M_dataplus._M_p._1_7_,
                        local_88.m_string.m_string._M_dataplus._M_p._0_1_) !=
            &local_88.m_string.m_string.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_88.m_string.m_string._M_dataplus._M_p._1_7_,
                                   local_88.m_string.m_string._M_dataplus._M_p._0_1_),
                          local_88.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.m_string.m_string._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8.m_string.m_string._M_dataplus._M_p,
                          local_d8.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        if (local_108 != &local_f8) {
          uVar7 = CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
          _Var8._M_p = (pointer)local_108;
LAB_00150a43:
          operator_delete(_Var8._M_p,uVar7 + 1);
        }
      }
      text = text + 1;
    } while (text != pRVar9);
  }
  local_d8.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_d8,1);
  std::ostream::flush();
  return;
}

Assistant:

void
    defaultListReporters( std::ostream& out,
                          std::vector<ReporterDescription> const& descriptions,
                          Verbosity verbosity ) {
        out << "Available reporters:\n";
        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ReporterDescription const& lhs,
                                  ReporterDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            if ( verbosity == Verbosity::Quiet ) {
                out << TextFlow::Column( desc.name )
                           .indent( 2 )
                           .width( 5 + maxNameLen )
                    << '\n';
            } else {
                out << TextFlow::Column( desc.name + ':' )
                               .indent( 2 )
                               .width( 5 + maxNameLen ) +
                           TextFlow::Column( desc.description )
                               .initialIndent( 0 )
                               .indent( 2 )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                    << '\n';
            }
        }
        out << '\n' << std::flush;
    }